

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O3

int mbedtls_dhm_parse_dhm(mbedtls_dhm_context *dhm,uchar *dhmin,size_t dhminlen)

{
  int iVar1;
  size_t sVar2;
  uchar *end;
  uchar *p;
  mbedtls_pem_context pem;
  size_t len;
  mbedtls_mpi rec;
  uchar *local_70;
  size_t local_68;
  mbedtls_pem_context local_60;
  size_t local_48;
  mbedtls_mpi local_40;
  
  local_68 = dhminlen;
  mbedtls_pem_init(&local_60);
  if (dhminlen == 0) {
    dhminlen = 0;
LAB_0012dd13:
    local_70 = dhmin;
    iVar1 = mbedtls_asn1_get_tag(&local_70,dhmin + dhminlen,&local_48,0x30);
    if (iVar1 == 0) {
      end = local_70 + local_48;
      iVar1 = mbedtls_asn1_get_mpi(&local_70,end,&dhm->P);
      if ((iVar1 != 0) || (iVar1 = mbedtls_asn1_get_mpi(&local_70,end,&dhm->G), iVar1 != 0))
      goto LAB_0012dd6b;
      if (local_70 != end) {
        mbedtls_mpi_init(&local_40);
        iVar1 = mbedtls_asn1_get_mpi(&local_70,end,&local_40);
        mbedtls_mpi_free(&local_40);
        if (iVar1 != 0) goto LAB_0012dd6b;
        iVar1 = -0x33e6;
        if (local_70 == end) goto LAB_0012dde7;
        goto LAB_0012dd71;
      }
LAB_0012dde7:
      sVar2 = mbedtls_mpi_size(&dhm->P);
      dhm->len = sVar2;
      mbedtls_pem_free(&local_60);
    }
    else {
LAB_0012dd6b:
      iVar1 = iVar1 + -0x3380;
LAB_0012dd71:
      mbedtls_pem_free(&local_60);
      if (iVar1 != 0) goto LAB_0012dd7f;
    }
    iVar1 = 0;
  }
  else {
    if (dhmin[dhminlen - 1] != '\0') goto LAB_0012dd13;
    iVar1 = mbedtls_pem_read_buffer
                      (&local_60,"-----BEGIN DH PARAMETERS-----","-----END DH PARAMETERS-----",dhmin
                       ,(uchar *)0x0,0,&local_68);
    if (iVar1 == 0) {
      local_68 = local_60.buflen;
      dhmin = local_60.buf;
      dhminlen = local_60.buflen;
      goto LAB_0012dd13;
    }
    dhminlen = local_68;
    if (iVar1 == -0x1080) goto LAB_0012dd13;
    mbedtls_pem_free(&local_60);
LAB_0012dd7f:
    mbedtls_dhm_free(dhm);
  }
  return iVar1;
}

Assistant:

int mbedtls_dhm_parse_dhm( mbedtls_dhm_context *dhm, const unsigned char *dhmin,
                   size_t dhminlen )
{
    int ret;
    size_t len;
    unsigned char *p, *end;
#if defined(MBEDTLS_PEM_PARSE_C)
    mbedtls_pem_context pem;

    mbedtls_pem_init( &pem );

    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if( dhminlen == 0 || dhmin[dhminlen - 1] != '\0' )
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    else
        ret = mbedtls_pem_read_buffer( &pem,
                               "-----BEGIN DH PARAMETERS-----",
                               "-----END DH PARAMETERS-----",
                               dhmin, NULL, 0, &dhminlen );

    if( ret == 0 )
    {
        /*
         * Was PEM encoded
         */
        dhminlen = pem.buflen;
    }
    else if( ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT )
        goto exit;

    p = ( ret == 0 ) ? pem.buf : (unsigned char *) dhmin;
#else
    p = (unsigned char *) dhmin;
#endif /* MBEDTLS_PEM_PARSE_C */
    end = p + dhminlen;

    /*
     *  DHParams ::= SEQUENCE {
     *      prime              INTEGER,  -- P
     *      generator          INTEGER,  -- g
     *      privateValueLength INTEGER OPTIONAL
     *  }
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        ret = MBEDTLS_ERR_DHM_INVALID_FORMAT + ret;
        goto exit;
    }

    end = p + len;

    if( ( ret = mbedtls_asn1_get_mpi( &p, end, &dhm->P  ) ) != 0 ||
        ( ret = mbedtls_asn1_get_mpi( &p, end, &dhm->G ) ) != 0 )
    {
        ret = MBEDTLS_ERR_DHM_INVALID_FORMAT + ret;
        goto exit;
    }

    if( p != end )
    {
        /* This might be the optional privateValueLength.
         * If so, we can cleanly discard it */
        mbedtls_mpi rec;
        mbedtls_mpi_init( &rec );
        ret = mbedtls_asn1_get_mpi( &p, end, &rec );
        mbedtls_mpi_free( &rec );
        if ( ret != 0 )
        {
            ret = MBEDTLS_ERR_DHM_INVALID_FORMAT + ret;
            goto exit;
        }
        if ( p != end )
        {
            ret = MBEDTLS_ERR_DHM_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH;
            goto exit;
        }
    }

    ret = 0;

    dhm->len = mbedtls_mpi_size( &dhm->P );

exit:
#if defined(MBEDTLS_PEM_PARSE_C)
    mbedtls_pem_free( &pem );
#endif
    if( ret != 0 )
        mbedtls_dhm_free( dhm );

    return( ret );
}